

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

mi_heap_t * mi_heap_get_backing(void)

{
  long in_FS_OFFSET;
  
  mi_thread_init();
  return *(mi_heap_t **)(**(long **)(in_FS_OFFSET + -0x28) + 0x10);
}

Assistant:

mi_heap_t* mi_heap_get_backing(void) {
  mi_heap_t* heap = mi_heap_get_default();
  mi_assert_internal(heap!=NULL);
  mi_heap_t* bheap = heap->tld->heap_backing;
  mi_assert_internal(bheap!=NULL);
  mi_assert_internal(bheap->thread_id == _mi_thread_id());
  return bheap;
}